

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_def.c
# Opt level: O0

str_t * newstr(upb_DefBuilder *ctx,char *data,size_t len)

{
  str_t *psVar1;
  str_t *ret;
  size_t len_local;
  char *data_local;
  upb_DefBuilder *ctx_local;
  
  psVar1 = (str_t *)_upb_DefBuilder_Alloc(ctx,len + 0x10);
  if (psVar1 == (str_t *)0x0) {
    _upb_DefBuilder_OomErr(ctx);
  }
  psVar1->len = len;
  if (len != 0) {
    memcpy(psVar1->str,data,len);
  }
  psVar1->str[len] = '\0';
  return psVar1;
}

Assistant:

static str_t* newstr(upb_DefBuilder* ctx, const char* data, size_t len) {
  str_t* ret = _upb_DefBuilder_Alloc(ctx, sizeof(*ret) + len);
  if (!ret) _upb_DefBuilder_OomErr(ctx);
  ret->len = len;
  if (len) memcpy(ret->str, data, len);
  ret->str[len] = '\0';
  return ret;
}